

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  uint uVar2;
  TextRange *pTVar3;
  char *pcVar4;
  TextRange *__dest;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  TextRange input_range;
  TextRange local_28;
  
  if ((this->Filters).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (TextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pTVar3 = (this->Filters).Data;
    if (pTVar3 != (TextRange *)0x0) {
      memcpy(__dest,pTVar3,(long)(this->Filters).Size << 4);
      pTVar3 = (this->Filters).Data;
      if ((pTVar3 != (TextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pTVar3,GImAllocatorUserData);
    }
    (this->Filters).Data = __dest;
    (this->Filters).Capacity = 0;
  }
  iVar10 = 0;
  (this->Filters).Size = 0;
  sVar5 = strlen(this->InputBuf);
  local_28.e = this->InputBuf + sVar5;
  local_28.b = this->InputBuf;
  TextRange::split(&local_28,',',&this->Filters);
  this->CountGrep = 0;
  uVar2 = (this->Filters).Size;
  if ((ulong)uVar2 == 0) {
    return;
  }
  pTVar3 = (this->Filters).Data;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  uVar7 = 0;
LAB_0010ad7e:
  if (uVar7 == uVar6) {
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                  ,0x4d7,
                  "T &ImVector<ImGuiTextFilter::TextRange>::operator[](int) [T = ImGuiTextFilter::TextRange]"
                 );
  }
  pcVar8 = pTVar3[uVar7].b;
  pcVar4 = pTVar3[uVar7].e;
  pcVar9 = pcVar8;
  if (pcVar8 < pcVar4) {
    do {
      if ((*pcVar8 != ' ') && (pcVar9 = pcVar8, *pcVar8 != '\t')) break;
      pcVar8 = pcVar8 + 1;
      pTVar3[uVar7].b = pcVar8;
      pcVar9 = pcVar4;
    } while (pcVar8 != pcVar4);
  }
  do {
    if (pcVar4 <= pcVar9) break;
    pcVar8 = pcVar4 + -1;
    if ((*pcVar8 != ' ') && (*pcVar8 != '\t')) break;
    pTVar3[uVar7].e = pcVar8;
    pcVar4 = pcVar8;
  } while( true );
  if ((pcVar9 != pcVar4) && (*pcVar9 != '-')) {
    iVar10 = iVar10 + 1;
    this->CountGrep = iVar10;
  }
  uVar7 = uVar7 + 1;
  if (uVar7 == uVar2) {
    return;
  }
  goto LAB_0010ad7e;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        TextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}